

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vocabulary.h
# Opt level: O1

void __thiscall NotFoundException::NotFoundException(NotFoundException *this,string *name)

{
  pointer pcVar1;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  *(undefined ***)this = &PTR__NotFoundException_0014fd50;
  (this->error_message)._M_dataplus._M_p = (pointer)&(this->error_message).field_2;
  (this->error_message)._M_string_length = 0;
  (this->error_message).field_2._M_local_buf[0] = '\0';
  pcVar1 = (name->_M_dataplus)._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar1,pcVar1 + name->_M_string_length);
  std::__cxx11::string::append((char *)local_48);
  std::__cxx11::string::operator=((string *)&this->error_message,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return;
}

Assistant:

NotFoundException(string name) {
        this->error_message = name + " is not found";
    }